

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O0

_Bool duckdb_je_sec_init(tsdn_t *tsdn,sec_t *sec,base_t *base,pai_t *fallback,sec_opts_t *opts)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  void *pvVar4;
  undefined8 in_RCX;
  undefined8 *in_RSI;
  ulong *in_R8;
  pszind_t j;
  _Bool err;
  sec_shard_t *shard;
  size_t i;
  sec_bin_t *bin_start;
  sec_bin_t *bin_cur;
  sec_shard_t *shard_cur;
  void *dynalloc;
  size_t sz_alloc;
  size_t sz_bins;
  size_t sz_shards;
  pszind_t npsizes;
  size_t max_alloc;
  pszind_t ind;
  pszind_t base_ind;
  pszind_t rg_inner_off;
  pszind_t lg_delta;
  pszind_t off_to_first_ps_rg;
  pszind_t x;
  malloc_mutex_lock_order_t in_stack_ffffffffffffff38;
  witness_rank_t in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  tsdn_t *in_stack_ffffffffffffff50;
  ulong local_a8;
  void *local_98;
  void *local_90;
  _Bool local_29;
  int local_4;
  
  uVar1 = in_R8[1];
  if ((uVar1 & 0xfffffffffffff000) < 0x7000000000000001) {
    uVar3 = lg_ceil(0x25679f4);
    if (uVar3 < 0xe) {
      in_stack_ffffffffffffff44 = 0;
    }
    else {
      in_stack_ffffffffffffff44 = uVar3 - 0xe;
    }
    if (in_stack_ffffffffffffff44 == 0) {
      in_stack_ffffffffffffff40 = 0xc;
    }
    else {
      in_stack_ffffffffffffff40 = in_stack_ffffffffffffff44 + 0xb;
    }
    local_4 = in_stack_ffffffffffffff44 * 4 +
              ((uint)((uVar1 & 0xfffffffffffff000) - 1 >> ((byte)in_stack_ffffffffffffff40 & 0x3f))
              & 3);
  }
  else {
    local_4 = 199;
  }
  local_90 = duckdb_je_base_alloc
                       (in_stack_ffffffffffffff50,
                        (base_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (local_90 == (void *)0x0) {
    local_29 = true;
  }
  else {
    in_RSI[0xd] = local_90;
    local_98 = (void *)((long)local_90 + *in_R8 * 0x90);
    for (local_a8 = 0; local_a8 < *in_R8; local_a8 = local_a8 + 1) {
      pvVar4 = (void *)((long)local_90 + 0x90);
      _Var2 = duckdb_je_malloc_mutex_init
                        ((malloc_mutex_t *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff4c = CONCAT13(_Var2,(int3)in_stack_ffffffffffffff4c);
      if (_Var2) {
        return true;
      }
      *(undefined1 *)((long)local_90 + 0x70) = 1;
      *(void **)((long)local_90 + 0x78) = local_98;
      for (in_stack_ffffffffffffff48 = 0; in_stack_ffffffffffffff48 < local_4 + 1U;
          in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 + 1) {
        sec_bin_init((sec_bin_t *)0x2567c14);
        local_98 = (void *)((long)local_98 + 0x18);
      }
      *(undefined8 *)((long)local_90 + 0x80) = 0;
      *(undefined4 *)((long)local_90 + 0x88) = 0;
      local_90 = pvVar4;
    }
    in_RSI[7] = in_RCX;
    memcpy(in_RSI + 8,in_R8,0x28);
    *(uint *)(in_RSI + 0xe) = local_4 + 1U;
    *in_RSI = sec_alloc;
    in_RSI[1] = duckdb_je_pai_alloc_batch_default;
    in_RSI[2] = sec_expand;
    in_RSI[3] = sec_shrink;
    in_RSI[4] = sec_dalloc;
    in_RSI[5] = duckdb_je_pai_dalloc_batch_default;
    local_29 = false;
  }
  return local_29;
}

Assistant:

bool
sec_init(tsdn_t *tsdn, sec_t *sec, base_t *base, pai_t *fallback,
    const sec_opts_t *opts) {
	assert(opts->max_alloc >= PAGE);

	size_t max_alloc = PAGE_FLOOR(opts->max_alloc);
	pszind_t npsizes = sz_psz2ind(max_alloc) + 1;

	size_t sz_shards = opts->nshards * sizeof(sec_shard_t);
	size_t sz_bins = opts->nshards * (size_t)npsizes * sizeof(sec_bin_t);
	size_t sz_alloc = sz_shards + sz_bins;
	void *dynalloc = base_alloc(tsdn, base, sz_alloc, CACHELINE);
	if (dynalloc == NULL) {
		return true;
	}
	sec_shard_t *shard_cur = (sec_shard_t *)dynalloc;
	sec->shards = shard_cur;
	sec_bin_t *bin_cur = (sec_bin_t *)&shard_cur[opts->nshards];
	/* Just for asserts, below. */
	sec_bin_t *bin_start = bin_cur;

	for (size_t i = 0; i < opts->nshards; i++) {
		sec_shard_t *shard = shard_cur;
		shard_cur++;
		bool err = malloc_mutex_init(&shard->mtx, "sec_shard",
		    WITNESS_RANK_SEC_SHARD, malloc_mutex_rank_exclusive);
		if (err) {
			return true;
		}
		shard->enabled = true;
		shard->bins = bin_cur;
		for (pszind_t j = 0; j < npsizes; j++) {
			sec_bin_init(&shard->bins[j]);
			bin_cur++;
		}
		shard->bytes_cur = 0;
		shard->to_flush_next = 0;
	}
	/*
	 * Should have exactly matched the bin_start to the first unused byte
	 * after the shards.
	 */
	assert((void *)shard_cur == (void *)bin_start);
	/* And the last bin to use up the last bytes of the allocation. */
	assert((char *)bin_cur == ((char *)dynalloc + sz_alloc));
	sec->fallback = fallback;


	sec->opts = *opts;
	sec->npsizes = npsizes;

	/*
	 * Initialize these last so that an improper use of an SEC whose
	 * initialization failed will segfault in an easy-to-spot way.
	 */
	sec->pai.alloc = &sec_alloc;
	sec->pai.alloc_batch = &pai_alloc_batch_default;
	sec->pai.expand = &sec_expand;
	sec->pai.shrink = &sec_shrink;
	sec->pai.dalloc = &sec_dalloc;
	sec->pai.dalloc_batch = &pai_dalloc_batch_default;

	return false;
}